

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

char * cmsys::SystemTools::RemoveCharsButUpperHex(char *str)

{
  size_t sVar1;
  char *pcVar2;
  char *pcVar3;
  char cVar4;
  char *pcVar5;
  
  if (str != (char *)0x0) {
    sVar1 = strlen(str);
    pcVar2 = (char *)operator_new__(sVar1 + 1);
    cVar4 = *str;
    pcVar3 = pcVar2;
    if (cVar4 != '\0') {
      pcVar5 = str + 1;
      do {
        if ((byte)(cVar4 - 0x30U) < 10 || (byte)(cVar4 + 0xbfU) < 6) {
          *pcVar3 = cVar4;
          pcVar3 = pcVar3 + 1;
        }
        cVar4 = *pcVar5;
        pcVar5 = pcVar5 + 1;
      } while (cVar4 != '\0');
    }
    *pcVar3 = '\0';
    return pcVar2;
  }
  return (char *)0x0;
}

Assistant:

char* SystemTools::RemoveCharsButUpperHex(const char* str)
{
  if (!str) {
    return 0;
  }
  char* clean_str = new char[strlen(str) + 1];
  char* ptr = clean_str;
  while (*str) {
    if ((*str >= '0' && *str <= '9') || (*str >= 'A' && *str <= 'F')) {
      *ptr++ = *str;
    }
    ++str;
  }
  *ptr = '\0';
  return clean_str;
}